

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_charset.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::char_overflow_handler::operator()
          (char_overflow_handler *this,range_check_result result)

{
  int in_ESI;
  source_location *in_stack_ffffffffffffff88;
  regex_error *in_stack_ffffffffffffff90;
  error_type in_stack_ffffffffffffff9c;
  regex_error *in_stack_ffffffffffffffa0;
  
  if (in_ESI != 0) {
    regex_error::regex_error
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(char *)in_stack_ffffffffffffff90
              );
    source_location::source_location
              ((source_location *)&stack0xffffffffffffff98,
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
               ,0x3f,
               "void boost::xpressive::detail::char_overflow_handler::operator()(numeric::range_check_result) const"
               ,0);
    throw_exception<boost::xpressive::regex_error>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void operator ()(numeric::range_check_result result) const // throw(regex_error)
    {
        if(numeric::cInRange != result)
        {
            BOOST_THROW_EXCEPTION(
                regex_error(
                    regex_constants::error_escape
                  , "character escape too large to fit in target character type"
                )
            );
        }
    }